

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# notch_pre.hpp
# Opt level: O3

Array __thiscall notch::pre::SquareAugmented::unapply(SquareAugmented *this,Array *input)

{
  ulong uVar1;
  ulong *in_RDX;
  float *extraout_RDX;
  float *extraout_RDX_00;
  float *pfVar2;
  void *__src;
  _func_int **pp_Var3;
  ulong __n;
  Array AVar4;
  
  uVar1 = *in_RDX;
  pp_Var3 = (_func_int **)(uVar1 >> 1);
  (this->super_ADatasetTransformer)._vptr_ADatasetTransformer = pp_Var3;
  __n = (long)pp_Var3 << 2;
  pp_Var3 = (_func_int **)operator_new(__n);
  this[1].super_ADatasetTransformer._vptr_ADatasetTransformer = pp_Var3;
  pfVar2 = extraout_RDX;
  if (1 < uVar1) {
    memset(pp_Var3,0,__n);
    __src = (void *)*in_RDX;
    if (__src != (void *)0x0) {
      __src = (void *)in_RDX[1];
    }
    memmove(pp_Var3,__src,__n);
    pfVar2 = extraout_RDX_00;
  }
  AVar4._M_data = pfVar2;
  AVar4._M_size = (size_t)this;
  return AVar4;
}

Assistant:

virtual Array unapply(const Array &input) {
        size_t n = input.size();
        Array output(0.0, n / 2);
        std::copy(std::begin(input),
                  std::begin(input) + (n/2),
                  std::begin(output));
        return output;
    }